

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ambient_light.cpp
# Opt level: O0

Light_EvalRes * embree::AmbientLight_eval(Light *super,DifferentialGeometry *dg,Vec3fa *dir)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *in_RCX;
  long in_RDX;
  long in_RSI;
  Light_EvalRes *in_RDI;
  float fVar5;
  AmbientLight *self;
  Light_EvalRes *res;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  float local_314;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 *local_298;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined8 *local_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 *local_1a0;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_188;
  undefined8 *local_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined8 *local_168;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 *local_100;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 *local_d0;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined8 *local_b8;
  undefined8 *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  Light_EvalRes::Light_EvalRes(in_RDI);
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  *(undefined8 *)&(in_RDI->value).field_0 = *(undefined8 *)(in_RSI + 0x10);
  *(undefined8 *)((long)&(in_RDI->value).field_0 + 8) = uVar1;
  fVar5 = std::numeric_limits<float>::infinity();
  in_RDI->dist = fVar5;
  local_298 = (undefined8 *)(in_RDX + 0x40);
  local_280 = &local_2b8;
  uVar1 = *local_298;
  uVar2 = *(undefined8 *)(in_RDX + 0x48);
  uVar3 = *in_RCX;
  uVar4 = in_RCX[1];
  local_268._0_4_ = (float)uVar1;
  local_268._4_4_ = (float)((ulong)uVar1 >> 0x20);
  uStack_260._0_4_ = (float)uVar2;
  uStack_260._4_4_ = (float)((ulong)uVar2 >> 0x20);
  local_278._0_4_ = (float)uVar3;
  local_278._4_4_ = (float)((ulong)uVar3 >> 0x20);
  uStack_270._0_4_ = (float)uVar4;
  uStack_270._4_4_ = (float)((ulong)uVar4 >> 0x20);
  local_258 = (float)local_268 * (float)local_278;
  fStack_254 = local_268._4_4_ * local_278._4_4_;
  fStack_250 = (float)uStack_260 * (float)uStack_270;
  fStack_24c = uStack_260._4_4_ * uStack_270._4_4_;
  local_1c8 = CONCAT44(fStack_254,local_258);
  uStack_1c0 = CONCAT44(fStack_24c,fStack_250);
  local_1b8 = &local_1f8;
  local_1a8 = &local_208;
  local_118 = CONCAT44(fStack_254,fStack_254);
  uStack_110 = CONCAT44(fStack_254,fStack_254);
  local_198 = &local_218;
  local_98 = CONCAT44(fStack_250,fStack_250);
  uStack_90 = CONCAT44(fStack_250,fStack_250);
  local_188 = &local_238;
  local_148 = local_258 + fStack_254;
  fStack_144 = fStack_254 + fStack_254;
  fStack_140 = fStack_250 + fStack_254;
  fStack_13c = fStack_24c + fStack_254;
  local_18 = CONCAT44(fStack_144,local_148);
  uStack_10 = CONCAT44(fStack_13c,fStack_140);
  local_180 = &local_228;
  local_178 = local_148 + fStack_250;
  fStack_174 = fStack_144 + fStack_250;
  fStack_170 = fStack_140 + fStack_250;
  fStack_16c = fStack_13c + fStack_250;
  local_1d8 = CONCAT44(fStack_174,local_178);
  uStack_1d0 = CONCAT44(fStack_16c,fStack_170);
  local_314 = local_178;
  if (local_178 < 0.0) {
    local_314 = 0.0;
  }
  local_288 = local_298;
  local_278 = uVar3;
  uStack_270 = uVar4;
  local_268 = uVar1;
  uStack_260 = uVar2;
  local_240 = local_280;
  local_1e0 = local_280;
  local_1b0 = local_1b8;
  local_1a0 = local_1b8;
  local_190 = local_198;
  local_168 = local_180;
  local_160 = local_1a8;
  local_158 = local_1b8;
  local_150 = local_188;
  local_138 = local_188;
  local_130 = local_180;
  local_128 = local_1b8;
  local_120 = local_1a8;
  local_100 = local_1a8;
  local_f8 = fStack_254;
  fStack_f4 = fStack_254;
  fStack_f0 = fStack_254;
  fStack_ec = fStack_254;
  local_e8 = local_1c8;
  uStack_e0 = uStack_1c0;
  local_d0 = local_1b8;
  local_c8 = local_1a8;
  local_c0 = local_1b8;
  local_b8 = local_198;
  local_b0 = local_188;
  local_a8 = local_1b8;
  local_a0 = local_198;
  local_80 = local_198;
  local_78 = fStack_250;
  fStack_74 = fStack_250;
  fStack_70 = fStack_250;
  fStack_6c = fStack_250;
  local_68 = local_1c8;
  uStack_60 = uStack_1c0;
  local_50 = local_1b8;
  local_48 = local_118;
  uStack_40 = uStack_110;
  local_38 = local_1c8;
  uStack_30 = uStack_1c0;
  local_28 = local_98;
  uStack_20 = uStack_90;
  local_2b8 = local_1c8;
  uStack_2b0 = uStack_1c0;
  local_238 = local_18;
  uStack_230 = uStack_10;
  local_228 = local_1d8;
  uStack_220 = uStack_1d0;
  local_218 = local_98;
  uStack_210 = uStack_90;
  local_208 = local_118;
  uStack_200 = uStack_110;
  local_1f8 = local_1c8;
  uStack_1f0 = uStack_1c0;
  fVar5 = cosineSampleHemispherePDF(local_314);
  in_RDI->pdf = fVar5;
  return in_RDI;
}

Assistant:

SYCL_EXTERNAL Light_EvalRes AmbientLight_eval(const Light* super,
                                                             const DifferentialGeometry& dg,
                                                             const Vec3fa& dir)
{
  AmbientLight* self = (AmbientLight*)super;
  Light_EvalRes res;

  res.value = self->radiance;
  res.dist = inf;
  res.pdf = cosineSampleHemispherePDF(max(dot(dg.Ns, dir), 0.f));

  return res;
}